

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg)

{
  int *piVar1;
  ImRect *pIVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  ImGuiNavLayer IVar7;
  ImGuiWindow *pIVar8;
  ImGuiWindow *pIVar9;
  ImVec2 IVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  bool bVar13;
  undefined4 in_register_00000034;
  ImGuiNavMoveResult *result;
  ImGuiContext *g;
  ImGui *this;
  float fVar14;
  float fVar15;
  ImVec2 IVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  pIVar11 = GImGui;
  result = (ImGuiNavMoveResult *)CONCAT44(in_register_00000034,id);
  pIVar8 = GImGui->CurrentWindow;
  if ((id != 0) &&
     ((((piVar1 = &(pIVar8->DC).NavLayerActiveMaskNext,
        *piVar1 = *piVar1 | (pIVar8->DC).NavLayerCurrentMask, pIVar11->NavId == id ||
        (pIVar11->NavAnyRequest == true)) &&
       (pIVar9 = pIVar11->NavWindow, pIVar9->RootWindowForNav == pIVar8->RootWindowForNav)) &&
      ((pIVar8 == pIVar9 || (((uint)(pIVar9->Flags | pIVar8->Flags) >> 0x17 & 1) != 0)))))) {
    if (nav_bb_arg == (ImRect *)0x0) {
      nav_bb_arg = bb;
    }
    uVar6 = (pIVar8->DC).ItemFlags;
    fVar20 = (pIVar8->Pos).x;
    fVar15 = (pIVar8->Pos).y;
    fVar19 = (nav_bb_arg->Min).x - fVar20;
    fVar14 = (nav_bb_arg->Min).y - fVar15;
    fVar20 = (nav_bb_arg->Max).x - fVar20;
    fVar15 = (nav_bb_arg->Max).y - fVar15;
    if ((pIVar11->NavInitRequest == true) && (pIVar11->NavLayer == (pIVar8->DC).NavLayerCurrent)) {
      if (((uVar6 & 0x10) == 0) || (pIVar11->NavInitResultId == 0)) {
        pIVar11->NavInitResultId = id;
        IVar16.y = fVar14;
        IVar16.x = fVar19;
        IVar10.y = fVar15;
        IVar10.x = fVar20;
        (pIVar11->NavInitResultRectRel).Min = IVar16;
        (pIVar11->NavInitResultRectRel).Max = IVar10;
      }
      if ((uVar6 & 0x10) == 0) {
        pIVar11->NavInitRequest = false;
        if (pIVar11->NavMoveRequest == false) {
          pIVar11->NavAnyRequest = false;
        }
        else {
          pIVar11->NavAnyRequest = true;
          if (pIVar11->NavWindow == (ImGuiWindow *)0x0) {
            __assert_fail("g.NavWindow != __null",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                          ,0x2002,"void ImGui::NavUpdateAnyRequestFlag()");
          }
        }
      }
    }
    if (((pIVar11->NavId != id) || ((pIVar11->NavMoveRequestFlags & 0x10) != 0)) &&
       ((uVar6 & 0xc) == 0)) {
      this = (ImGui *)&pIVar11->NavMoveResultOther;
      if (pIVar11->NavWindow == pIVar8) {
        this = (ImGui *)&pIVar11->NavMoveResultLocal;
      }
      if ((pIVar11->NavMoveRequest == true) &&
         (bVar12 = NavScoreItem(this,result,*nav_bb_arg), bVar12)) {
        *(ImGuiWindow **)this = pIVar8;
        *(ImGuiID *)(this + 8) = id;
        *(ImGuiID *)(this + 0xc) = (pIVar8->DC).NavFocusScopeIdCurrent;
        *(float *)(this + 0x1c) = fVar19;
        *(float *)(this + 0x20) = fVar14;
        *(float *)(this + 0x24) = fVar20;
        *(float *)(this + 0x28) = fVar15;
      }
      if ((pIVar11->NavMoveRequestFlags & 0x20) != 0) {
        fVar3 = (nav_bb_arg->Min).y;
        fVar17 = (pIVar8->ClipRect).Max.y;
        if (fVar3 < fVar17) {
          fVar4 = (nav_bb_arg->Max).y;
          fVar5 = (pIVar8->ClipRect).Min.y;
          if (((fVar5 < fVar4) &&
              (fVar18 = (pIVar8->ClipRect).Max.x,
              (nav_bb_arg->Min).x <= fVar18 && fVar18 != (nav_bb_arg->Min).x)) &&
             (fVar18 = (nav_bb_arg->Max).x,
             (pIVar8->ClipRect).Min.x <= fVar18 && fVar18 != (pIVar8->ClipRect).Min.x)) {
            fVar18 = fVar17;
            if (fVar4 <= fVar17) {
              fVar18 = fVar4;
            }
            if (fVar3 <= fVar17) {
              fVar17 = fVar3;
            }
            if (((fVar4 - fVar3) * 0.7 <=
                 (float)(-(uint)(fVar4 < fVar5) & (uint)fVar5 |
                        ~-(uint)(fVar4 < fVar5) & (uint)fVar18) -
                 (float)(-(uint)(fVar3 < fVar5) & (uint)fVar5 |
                        ~-(uint)(fVar3 < fVar5) & (uint)fVar17)) &&
               (bVar12 = NavScoreItem((ImGui *)&pIVar11->NavMoveResultLocalVisibleSet,result,
                                      *nav_bb_arg), bVar12)) {
              (pIVar11->NavMoveResultLocalVisibleSet).Window = pIVar8;
              (pIVar11->NavMoveResultLocalVisibleSet).ID = id;
              (pIVar11->NavMoveResultLocalVisibleSet).FocusScopeId =
                   (pIVar8->DC).NavFocusScopeIdCurrent;
              (pIVar11->NavMoveResultLocalVisibleSet).RectRel.Min.x = fVar19;
              (pIVar11->NavMoveResultLocalVisibleSet).RectRel.Min.y = fVar14;
              (pIVar11->NavMoveResultLocalVisibleSet).RectRel.Max.x = fVar20;
              (pIVar11->NavMoveResultLocalVisibleSet).RectRel.Max.y = fVar15;
            }
          }
        }
      }
    }
    if (pIVar11->NavId == id) {
      pIVar11->NavWindow = pIVar8;
      IVar7 = (pIVar8->DC).NavLayerCurrent;
      pIVar11->NavLayer = IVar7;
      pIVar11->NavFocusScopeId = (pIVar8->DC).NavFocusScopeIdCurrent;
      pIVar11->NavIdIsAlive = true;
      pIVar11->NavIdTabCounter = (pIVar8->DC).FocusCounterTabStop;
      pIVar2 = pIVar8->NavRectRel + IVar7;
      (pIVar2->Min).x = fVar19;
      (pIVar2->Min).y = fVar14;
      (pIVar2->Max).x = fVar20;
      (pIVar2->Max).y = fVar15;
    }
  }
  (pIVar8->DC).LastItemId = id;
  IVar10 = bb->Max;
  (pIVar8->DC).LastItemRect.Min = bb->Min;
  (pIVar8->DC).LastItemRect.Max = IVar10;
  (pIVar8->DC).LastItemStatusFlags = 0;
  (pIVar11->NextItemData).Flags = 0;
  bVar12 = IsClippedEx(bb,id,false);
  if ((!bVar12) && (bVar13 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar13)) {
    (pIVar8->DC).LastItemStatusFlags = 1;
  }
  return !bVar12;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (id != 0)
    {
        // Navigation processing runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        window->DC.NavLayerActiveMaskNext |= window->DC.NavLayerCurrentMask;
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem(window, nav_bb_arg ? *nav_bb_arg : bb, id);

        // [DEBUG] Item Picker tool, when enabling the "extended" version we perform the check in ItemAdd()
#ifdef IMGUI_DEBUG_TOOL_ITEM_PICKER_EX
        if (id == g.DebugItemPickerBreakId)
        {
            IM_DEBUG_BREAK();
            g.DebugItemPickerBreakId = 0;
        }
#endif
    }

    window->DC.LastItemId = id;
    window->DC.LastItemRect = bb;
    window->DC.LastItemStatusFlags = ImGuiItemStatusFlags_None;
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id, false);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}